

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack1_16(uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 1;
  out[1] = *in >> 1 & 1;
  out[2] = *in >> 2 & 1;
  out[3] = *in >> 3 & 1;
  out[4] = *in >> 4 & 1;
  out[5] = *in >> 5 & 1;
  out[6] = *in >> 6 & 1;
  out[7] = *in >> 7 & 1;
  out[8] = *in >> 8 & 1;
  out[9] = *in >> 9 & 1;
  out[10] = *in >> 10 & 1;
  out[0xb] = *in >> 0xb & 1;
  out[0xc] = *in >> 0xc & 1;
  out[0xd] = *in >> 0xd & 1;
  out[0xe] = *in >> 0xe & 1;
  out[0xf] = *in >> 0xf & 1;
  return in + 1;
}

Assistant:

const uint32_t *__fastunpack1_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) & 1;
  out++;
  *out = ((*in) >> 1) & 1;
  out++;
  *out = ((*in) >> 2) & 1;
  out++;
  *out = ((*in) >> 3) & 1;
  out++;
  *out = ((*in) >> 4) & 1;
  out++;
  *out = ((*in) >> 5) & 1;
  out++;
  *out = ((*in) >> 6) & 1;
  out++;
  *out = ((*in) >> 7) & 1;
  out++;
  *out = ((*in) >> 8) & 1;
  out++;
  *out = ((*in) >> 9) & 1;
  out++;
  *out = ((*in) >> 10) & 1;
  out++;
  *out = ((*in) >> 11) & 1;
  out++;
  *out = ((*in) >> 12) & 1;
  out++;
  *out = ((*in) >> 13) & 1;
  out++;
  *out = ((*in) >> 14) & 1;
  out++;
  *out = ((*in) >> 15) & 1;
  out++;

  return in + 1;
}